

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

void __thiscall Timer::addTimerNode(Timer *this,TimerNode *newTimer)

{
  bool bVar1;
  Node *pNVar2;
  int iVar3;
  iterator i;
  TimerNode timer;
  iterator local_68;
  list<Timer::TimerNode> *local_60;
  TimerNode local_58;
  
  local_60 = &this->mList;
  pNVar2 = ((this->mList).mHead)->next;
  bVar1 = false;
  local_68.mNode = pNVar2;
  while (pNVar2 != (this->mList).mTail) {
    TimerNode::TimerNode(&local_58,&pNVar2->val);
    iVar3 = newTimer->mTick - local_58.mTick;
    if (iVar3 < 0) {
      bVar1 = true;
      JetHead::list<Timer::TimerNode>::iterator::insertBefore(&local_68,newTimer);
    }
    SmartPtr<Event>::~SmartPtr(&local_58.mEvent);
    if (iVar3 < 0) break;
    pNVar2 = (Node *)0x0;
    if (local_68.mNode != (Node *)0x0) {
      pNVar2 = (local_68.mNode)->next;
      local_68.mNode = pNVar2;
    }
  }
  if (!bVar1) {
    JetHead::list<Timer::TimerNode>::push_back(local_60,newTimer);
  }
  return;
}

Assistant:

void Timer::addTimerNode( const TimerNode& newTimer )
{
	TRACE_BEGIN( LOG_LVL_NOISE );

	int32_t diff;
	bool inserted = false;

	// Add new timer node to the list (sorted)	
	for (JetHead::list<TimerNode>::iterator i = mList.begin();
		 i != mList.end(); ++i)
	{
		TimerNode timer = *i;
		diff = newTimer.mTick - timer.mTick;
		
		if ( diff < 0 )
		{
			i.insertBefore(newTimer);			
			inserted = true;
			break;
		}
	}
	
	if ( not inserted )
	{
		mList.push_back( newTimer );
	}
}